

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 local_c0 [8];
  string dmax;
  string dmin;
  char *c;
  undefined1 local_70 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  int local_2c;
  int n;
  int maxlen_local;
  string *max_local;
  string *min_local;
  RE2 *this_local;
  
  if (this->prog_ == (Prog *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0033fd82;
  }
  local_2c = maxlen;
  _n = max;
  max_local = min;
  min_local = (string *)this;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->prefix_);
  local_30 = (int)sVar2;
  if (local_2c < local_30) {
    local_30 = local_2c;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,&this->prefix_,0,(long)local_30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (max_local,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             &this->prefix_,0,(long)local_30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (_n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  if (*(int *)&this->field_0x44 < 0) {
    for (c._4_4_ = 0; c._4_4_ < local_30; c._4_4_ = c._4_4_ + 1) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          max_local,(long)c._4_4_);
      if (('`' < *pvVar3) && (*pvVar3 < '{')) {
        *pvVar3 = *pvVar3 + -0x20;
      }
    }
  }
  std::__cxx11::string::string((string *)(dmax.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c0);
  local_2c = local_2c - local_30;
  if ((local_2c < 1) ||
     (bVar1 = Prog::PossibleMatchRange
                        (this->prog_,(string *)((long)&dmax.field_2 + 8),(string *)local_c0,local_2c
                        ), !bVar1)) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty(_n);
    if (!bVar1) {
      PrefixSuccessor((string *)_n);
      goto LAB_0033fd5c;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (max_local,"");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (_n,"");
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)max_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dmax.field_2 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_n,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
LAB_0033fd5c:
    this_local._7_1_ = 1;
  }
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)(dmax.field_2._M_local_buf + 8));
LAB_0033fd82:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RE2::PossibleMatchRange(std::string* min, std::string* max,
                             int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  *min = prefix_.substr(0, n);
  *max = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change *min to uppercase.
    for (int i = 0; i < n; i++) {
      char& c = (*min)[i];
      if ('a' <= c && c <= 'z')
        c += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  std::string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    min->append(dmin);
    max->append(dmax);
  } else if (!max->empty()) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up *max to allow any possible suffix.
    PrefixSuccessor(max);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  return true;
}